

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O0

char * mcpl_internal_malloc(size_t n)

{
  char *pcVar1;
  size_t in_RDI;
  char *res;
  undefined8 local_18;
  
  local_18 = in_RDI;
  if (in_RDI == 0) {
    local_18 = 1;
  }
  pcVar1 = (char *)malloc(local_18);
  if (pcVar1 == (char *)0x0) {
    mcpl_error((char *)0x101489);
  }
  return pcVar1;
}

Assistant:

MCPL_LOCAL char * mcpl_internal_malloc(size_t n)
{
  char * res = (char*)malloc(n ? n : 1);
  if (!res)
    mcpl_error("memory allocation failed");
  return res;
}